

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallsList.cpp
# Opt level: O3

void __thiscall
MockExpectedCallsList::deleteAllExpectationsAndClearList(MockExpectedCallsList *this)

{
  MockCheckedExpectedCall *pMVar1;
  MockExpectedCallsListNode *pMVar2;
  MockExpectedCallsListNode *mem;
  
  mem = this->head_;
  while (mem != (MockExpectedCallsListNode *)0x0) {
    pMVar1 = mem->expectedCall_;
    pMVar2 = mem->next_;
    if (pMVar1 != (MockCheckedExpectedCall *)0x0) {
      (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[1])(pMVar1);
      mem = this->head_;
    }
    operator_delete(mem,0x10);
    this->head_ = pMVar2;
    mem = pMVar2;
  }
  return;
}

Assistant:

void MockExpectedCallsList::deleteAllExpectationsAndClearList()
{
    while (head_) {
        MockExpectedCallsListNode* next = head_->next_;
        delete head_->expectedCall_;
        delete head_;
        head_ = next;
    }
}